

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O2

void __thiscall sznet::net::Buffer::shrink(Buffer *this,size_t reserve)

{
  StringPiece local_68;
  undefined1 local_58 [8];
  Buffer other;
  
  Buffer((Buffer *)local_58,4,0x400);
  ensureWritableBytes((Buffer *)local_58,(reserve + this->m_writerIndex) - this->m_readerIndex);
  local_68.m_ptr =
       (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_start + this->m_readerIndex;
  local_68.m_length = (int)this->m_writerIndex - (int)this->m_readerIndex;
  append((Buffer *)local_58,&local_68);
  swap(this,(Buffer *)local_58);
  this->m_wrapSize =
       (ulong)(((long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage -
               (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start) * 3) >> 2;
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&other);
  return;
}

Assistant:

void shrink(size_t reserve)
	{
		// FIXME: use vector::shrink_to_fit() in C++ 11 if possible.
		Buffer other;
		other.ensureWritableBytes(readableBytes() + reserve);
		other.append(toStringPiece());
		swap(other);
		m_wrapSize = m_buffer.capacity() * 3 / 4;
	}